

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

lookahead_entry * av1_lookahead_peek(lookahead_ctx *ctx,int index,COMPRESSOR_STAGE stage)

{
  read_ctx *prVar1;
  read_ctx *read_ctx;
  lookahead_entry *buf;
  COMPRESSOR_STAGE stage_local;
  int index_local;
  lookahead_ctx *ctx_local;
  lookahead_entry *local_8;
  
  buf = (lookahead_entry *)0x0;
  if (ctx == (lookahead_ctx *)0x0) {
    local_8 = (lookahead_entry *)0x0;
  }
  else {
    prVar1 = ctx->read_ctxs + stage;
    if (index < 0) {
      if ((index < 0) && (-index <= (int)(uint)ctx->max_pre_frames)) {
        index_local = prVar1->read_idx + index;
        if (index_local < 0) {
          index_local = ctx->max_sz + index_local;
        }
        buf = ctx->buf + index_local;
      }
    }
    else if (index < prVar1->sz) {
      index_local = prVar1->read_idx + index;
      if (ctx->max_sz <= index_local) {
        index_local = index_local - ctx->max_sz;
      }
      buf = ctx->buf + index_local;
    }
    local_8 = buf;
  }
  return local_8;
}

Assistant:

struct lookahead_entry *av1_lookahead_peek(struct lookahead_ctx *ctx, int index,
                                           COMPRESSOR_STAGE stage) {
  struct lookahead_entry *buf = NULL;
  if (ctx == NULL) {
    return buf;
  }

  struct read_ctx *read_ctx = &ctx->read_ctxs[stage];
  assert(read_ctx->valid == 1);
  if (index >= 0) {
    // Forward peek
    if (index < read_ctx->sz) {
      index += read_ctx->read_idx;
      if (index >= ctx->max_sz) index -= ctx->max_sz;
      buf = ctx->buf + index;
    }
  } else if (index < 0) {
    // Backward peek
    if (-index <= ctx->max_pre_frames) {
      index += (int)(read_ctx->read_idx);
      if (index < 0) index += (int)(ctx->max_sz);
      buf = ctx->buf + index;
    }
  }

  return buf;
}